

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::FieldDescriptorProto::ByteSizeLong(FieldDescriptorProto *this)

{
  int iVar1;
  size_t sVar2;
  FieldDescriptorProto *in_RDI;
  int cached_size;
  uint32 cached_has_bits;
  size_t total_size;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar3;
  FieldDescriptorProto *metadata;
  size_t local_28;
  
  local_28 = 0;
  uVar3 = (in_RDI->_has_bits_).has_bits_[0];
  metadata = in_RDI;
  if ((uVar3 & 0xff) != 0) {
    if ((uVar3 & 1) != 0) {
      _internal_name_abi_cxx11_((FieldDescriptorProto *)0x6814dc);
      sVar2 = internal::WireFormatLite::StringSize((string *)0x6814e4);
      local_28 = sVar2 + 1 + local_28;
    }
    if ((uVar3 & 2) != 0) {
      _internal_extendee_abi_cxx11_((FieldDescriptorProto *)0x681507);
      sVar2 = internal::WireFormatLite::StringSize((string *)0x68150f);
      local_28 = sVar2 + 1 + local_28;
    }
    if ((uVar3 & 4) != 0) {
      _internal_type_name_abi_cxx11_((FieldDescriptorProto *)0x681532);
      sVar2 = internal::WireFormatLite::StringSize((string *)0x68153a);
      local_28 = sVar2 + 1 + local_28;
    }
    if ((uVar3 & 8) != 0) {
      _internal_default_value_abi_cxx11_((FieldDescriptorProto *)0x68155d);
      sVar2 = internal::WireFormatLite::StringSize((string *)0x681565);
      local_28 = sVar2 + 1 + local_28;
    }
    if ((uVar3 & 0x10) != 0) {
      _internal_json_name_abi_cxx11_((FieldDescriptorProto *)0x681588);
      sVar2 = internal::WireFormatLite::StringSize((string *)0x681590);
      local_28 = sVar2 + 1 + local_28;
    }
    if ((uVar3 & 0x20) != 0) {
      sVar2 = internal::WireFormatLite::MessageSize<google::protobuf::FieldOptions>
                        ((FieldOptions *)0x6815b7);
      local_28 = sVar2 + 1 + local_28;
    }
    if ((uVar3 & 0x40) != 0) {
      _internal_number(in_RDI);
      sVar2 = internal::WireFormatLite::Int32Size(0);
      local_28 = sVar2 + 1 + local_28;
    }
    if ((uVar3 & 0x80) != 0) {
      _internal_oneof_index(in_RDI);
      sVar2 = internal::WireFormatLite::Int32Size(0);
      local_28 = sVar2 + 1 + local_28;
    }
  }
  if ((uVar3 & 0x300) != 0) {
    if ((uVar3 & 0x100) != 0) {
      _internal_label(in_RDI);
      sVar2 = internal::WireFormatLite::EnumSize(0);
      local_28 = sVar2 + 1 + local_28;
    }
    if ((uVar3 & 0x200) != 0) {
      _internal_type(in_RDI);
      sVar2 = internal::WireFormatLite::EnumSize(0);
      local_28 = sVar2 + 1 + local_28;
    }
  }
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    local_28 = internal::ComputeUnknownFieldsSize
                         ((InternalMetadataWithArena *)metadata,local_28,
                          (CachedSize *)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
  }
  else {
    iVar1 = internal::ToCachedSize(local_28);
    SetCachedSize((FieldDescriptorProto *)CONCAT44(uVar3,iVar1),(int)((ulong)in_RDI >> 0x20));
  }
  return local_28;
}

Assistant:

size_t FieldDescriptorProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.FieldDescriptorProto)
  size_t total_size = 0;

  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x000000ffu) {
    // optional string name = 1;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_name());
    }

    // optional string extendee = 2;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_extendee());
    }

    // optional string type_name = 6;
    if (cached_has_bits & 0x00000004u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_type_name());
    }

    // optional string default_value = 7;
    if (cached_has_bits & 0x00000008u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_default_value());
    }

    // optional string json_name = 10;
    if (cached_has_bits & 0x00000010u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_json_name());
    }

    // optional .google.protobuf.FieldOptions options = 8;
    if (cached_has_bits & 0x00000020u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *options_);
    }

    // optional int32 number = 3;
    if (cached_has_bits & 0x00000040u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_number());
    }

    // optional int32 oneof_index = 9;
    if (cached_has_bits & 0x00000080u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_oneof_index());
    }

  }
  if (cached_has_bits & 0x00000300u) {
    // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
    if (cached_has_bits & 0x00000100u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_label());
    }

    // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
    if (cached_has_bits & 0x00000200u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_type());
    }

  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    return ::PROTOBUF_NAMESPACE_ID::internal::ComputeUnknownFieldsSize(
        _internal_metadata_, total_size, &_cached_size_);
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}